

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O1

void __thiscall
tchecker::typed_sum_to_clock_assign_statement_t::typed_sum_to_clock_assign_statement_t
          (typed_sum_to_clock_assign_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_lvalue_expression_t> *lvalue,
          shared_ptr<const_tchecker::typed_expression_t> *rvalue)

{
  bool bVar1;
  int iVar2;
  invalid_argument *this_00;
  
  *(undefined ***)&(this->super_typed_assign_statement_t).super_typed_statement_t =
       &PTR__statement_t_001e75c8;
  typed_assign_statement_t::typed_assign_statement_t
            (&this->super_typed_assign_statement_t,&PTR_construction_vtable_56__001e5f40,type,lvalue
             ,rvalue);
  *(undefined8 *)&(this->super_typed_assign_statement_t).super_typed_statement_t = 0x1e5e98;
  *(undefined8 *)&(this->super_typed_assign_statement_t).super_assign_statement_t = 0x1e5f08;
  iVar2 = (**(code **)(*(long *)&((lvalue->
                                  super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->super_typed_expression_t + 0x38))();
  if (iVar2 == 1) {
    bVar1 = clock_assignable((((lvalue->
                               super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->super_typed_expression_t)._type);
    if (bVar1) {
      if (((rvalue->
           super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->_type == EXPR_TYPE_INTCLKSUM) {
        return;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"rvalue is not the sum of an int-clock sum");
    }
    else {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"lvalue is not an assignable clock");
    }
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"lvalue of size > 1 is not assignable");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typed_sum_to_clock_assign_statement_t::typed_sum_to_clock_assign_statement_t(
    enum tchecker::statement_type_t type, std::shared_ptr<tchecker::typed_lvalue_expression_t const> const & lvalue,
    std::shared_ptr<tchecker::typed_expression_t const> const & rvalue)
    : tchecker::typed_assign_statement_t(type, lvalue, rvalue)
{
  if (lvalue->size() != 1)
    throw std::invalid_argument("lvalue of size > 1 is not assignable");
  if (!tchecker::clock_assignable(lvalue->type()))
    throw std::invalid_argument("lvalue is not an assignable clock");
  if (rvalue->type() != tchecker::EXPR_TYPE_INTCLKSUM)
    throw std::invalid_argument("rvalue is not the sum of an int-clock sum");
}